

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O2

bool __thiscall cmCTestUploadCommand::CheckArgumentValue(cmCTestUploadCommand *this,string *arg)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  string filename;
  string local_1b0;
  ostringstream e;
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    std::__cxx11::string::string((string *)&filename,(string *)arg);
    bVar1 = cmsys::SystemTools::FileExists(filename._M_dataplus._M_p);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->Files,&filename);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"File \"");
      poVar2 = std::operator<<(poVar2,(string *)&filename);
      poVar2 = std::operator<<(poVar2,"\" does not exist. Cannot submit ");
      std::operator<<(poVar2,"a non-existent file.");
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    std::__cxx11::string::~string((string *)&filename);
    return bVar1;
  }
  bVar1 = cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  return bVar1;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentValue(std::string const& arg)
{
  if(this->ArgumentDoing == ArgumentDoingFiles)
    {
    std::string filename(arg);
    if(cmSystemTools::FileExists(filename.c_str()))
      {
      this->Files.insert(filename);
      return true;
      }
    else
      {
      std::ostringstream e;
      e << "File \"" << filename << "\" does not exist. Cannot submit "
          << "a non-existent file.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return false;
      }
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}